

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O2

void process_expression(CompilerState *compiler_state,AstNode *node)

{
  uint op;
  UnaryOperatorType op_00;
  Scope *pSVar1;
  AstNode *pAVar2;
  AstNode *pAVar3;
  LuaSymbolList *pLVar4;
  Scope *pSVar5;
  AstNodeList *pAVar6;
  AstNodeList *pAVar7;
  LuaSymbolList *pLVar8;
  Scope *pSVar9;
  AstNode *pAVar10;
  AstNodeList *pAVar11;
  AstNodeList *pAVar12;
  LuaSymbolList *pLVar13;
  AstNodeList *pAVar14;
  LuaSymbolList *pLVar15;
  int iVar16;
  long lVar17;
  void *pvVar18;
  anon_union_72_25_595a31af_for_AstNode_2 *p1;
  AstNodeList *pAVar19;
  LiteralExpression local_58;
  AstNodeList *local_30;
  
LAB_0010a128:
  lVar17 = 0x20;
  switch(node->type) {
  case EXPR_LITERAL:
  case EXPR_SYMBOL:
  case EXPR_BUILTIN:
    goto switchD_0010a140_caseD_f;
  case EXPR_Y_INDEX:
  case EXPR_FIELD_SELECTOR:
    goto switchD_0010a140_caseD_11;
  case EXPR_TABLE_ELEMENT_ASSIGN:
    pAVar2 = (node->field_2).function_stmt.function_expr;
    lVar17 = 0x28;
    if (pAVar2 != (AstNode *)0x0) {
      process_expression(compiler_state,pAVar2);
    }
    goto switchD_0010a140_caseD_11;
  case EXPR_SUFFIXED:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    pAVar19 = (node->field_2).for_stmt.for_statement_list;
    if (pAVar19 == (AstNodeList *)0x0) {
      pSVar1 = (node->field_2).for_stmt.for_body;
      pAVar2 = pSVar1->function;
      pAVar19 = (AstNodeList *)pSVar1->parent;
      pLVar4 = pSVar1->symbol_list;
      pSVar5 = *(Scope **)&pSVar1->field_0x18;
      pAVar3 = pSVar1[1].function;
      pAVar6 = (AstNodeList *)pSVar1[1].parent;
      pAVar7 = (AstNodeList *)pSVar1[1].symbol_list;
      pLVar8 = *(LuaSymbolList **)&pSVar1[1].field_0x18;
      pSVar9 = *(Scope **)&pSVar1->field_0x18;
      pAVar10 = pSVar1[1].function;
      pAVar11 = (AstNodeList *)pSVar1[1].parent;
      pAVar12 = (AstNodeList *)pSVar1[1].symbol_list;
      pLVar13 = *(LuaSymbolList **)&pSVar1[1].field_0x18;
      pAVar14 = (AstNodeList *)pSVar1[2].function;
      pLVar15 = (LuaSymbolList *)pSVar1[2].parent;
      (node->field_2).goto_stmt.name = (StringObject *)pSVar1->symbol_list;
      (node->field_2).goto_stmt.goto_scope = pSVar9;
      (node->field_2).function_stmt.function_expr = pAVar10;
      (node->field_2).for_stmt.for_statement_list = pAVar11;
      (node->field_2).function_expr.function_statement_list = pAVar12;
      (node->field_2).function_expr.args = pLVar13;
      (node->field_2).function_expr.child_functions = pAVar14;
      (node->field_2).function_expr.upvalues = pLVar15;
      *(AstNode **)node = pAVar2;
      (node->field_2).return_stmt.expr_list = pAVar19;
      (node->field_2).goto_stmt.name = (StringObject *)pLVar4;
      (node->field_2).goto_stmt.goto_scope = pSVar5;
      (node->field_2).function_stmt.function_expr = pAVar3;
      (node->field_2).for_stmt.for_statement_list = pAVar6;
      (node->field_2).function_expr.function_statement_list = pAVar7;
      (node->field_2).function_expr.args = pLVar8;
      return;
    }
    break;
  case EXPR_UNARY:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    pAVar2 = (node->field_2).function_stmt.function_expr;
    if (pAVar2->type != EXPR_LITERAL) {
      return;
    }
    op = (node->field_2).builtin_expr.token;
    if ((op & 0xfffffffe) != 0x16) {
      return;
    }
    p1 = &pAVar2->field_2;
    local_58.type.type_code = RAVI_TANY;
    local_58.type._4_4_ = 0;
    local_58.type.type_name = (StringObject *)0x0;
    local_58._16_8_ = 0;
    local_58.u.r = 0.0;
    iVar16 = luaO_rawarith(compiler_state,op,&p1->literal_expr,&p1->literal_expr,&local_58);
    if (iVar16 == 0) {
      return;
    }
    node->type = EXPR_LITERAL;
    (node->field_2).common_expr.type.type_code = local_58.type.type_code;
    if (local_58.type.type_code == RAVI_TNUMINT) {
LAB_0010a35a:
      (node->field_2).function_stmt.function_expr = (AstNode *)local_58.u;
      return;
    }
    if (local_58.type.type_code != RAVI_TNUMFLT) {
      __assert_fail("node->literal_expr.type.type_code == RAVI_TNUMINT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                    ,0x1d9,"void process_expression(CompilerState *, AstNode *)");
    }
    goto LAB_0010a1ea;
  case EXPR_BINARY:
    if ((node->field_2).unary_expr.unary_op != 0xc) {
      process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
      process_expression(compiler_state,(node->field_2).binary_expr.expr_right);
      pAVar2 = (node->field_2).function_stmt.function_expr;
      if (pAVar2->type != EXPR_LITERAL) {
        return;
      }
      pAVar3 = (node->field_2).binary_expr.expr_right;
      if (pAVar3->type != EXPR_LITERAL) {
        return;
      }
      op_00 = (node->field_2).unary_expr.unary_op;
      if (0xb < op_00) {
        return;
      }
      local_58.type.type_code = RAVI_TANY;
      local_58.type._4_4_ = 0;
      local_58.type.type_name = (StringObject *)0x0;
      local_58._16_8_ = 0;
      local_58.u.r = 0.0;
      iVar16 = luaO_rawarith(compiler_state,op_00,&(pAVar2->field_2).literal_expr,
                             &(pAVar3->field_2).literal_expr,&local_58);
      if (iVar16 == 0) {
        return;
      }
      node->type = EXPR_LITERAL;
      (node->field_2).common_expr.type.type_code = local_58.type.type_code;
      if (local_58.type.type_code == RAVI_TNUMINT) goto LAB_0010a35a;
      if (local_58.type.type_code != RAVI_TNUMFLT) {
        __assert_fail("node->literal_expr.type.type_code == RAVI_TNUMINT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                      ,0x1c2,"void process_expression(CompilerState *, AstNode *)");
      }
LAB_0010a1ea:
      (node->field_2).function_stmt.function_expr = (AstNode *)local_58.u;
      return;
    }
    local_30 = (AstNodeList *)0x0;
    walk_binary_expr(compiler_state,node,&local_30);
    node->type = EXPR_CONCAT;
    (node->field_2).function_stmt.function_expr = (AstNode *)local_30;
    (node->field_2).common_expr.type.type_code = RAVI_TSTRING;
    raviX_ptrlist_forward_iterator((PtrListIterator *)&local_58,(PtrList *)local_30);
    goto LAB_0010a23a;
  case EXPR_FUNCTION:
    process_statement_list(compiler_state,(node->field_2).function_expr.function_statement_list);
    return;
  case EXPR_TABLE_LITERAL:
    pAVar19 = (node->field_2).table_expr.expr_list;
    break;
  case EXPR_FUNCTION_CALL:
    pAVar19 = (node->field_2).for_stmt.for_statement_list;
    break;
  case EXPR_CONCAT:
    goto switchD_0010a140_caseD_1a;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                  ,500,"void process_expression(CompilerState *, AstNode *)");
  }
  process_expression_list(compiler_state,pAVar19);
  return;
switchD_0010a140_caseD_11:
  node = *(AstNode **)((long)&node->type + lVar17);
  goto LAB_0010a128;
LAB_0010a23a:
  do {
    pvVar18 = raviX_ptrlist_iter_next((PtrListIterator *)&local_58);
    if (pvVar18 == (void *)0x0) goto switchD_0010a140_caseD_1a;
  } while ((*(int *)((long)pvVar18 + 8) == 0x10) || (*(int *)((long)pvVar18 + 8) == 0x101));
  (node->field_2).common_expr.type.type_code = RAVI_TANY;
switchD_0010a140_caseD_1a:
  process_expression_list(compiler_state,(node->field_2).table_expr.expr_list);
switchD_0010a140_caseD_f:
  return;
}

Assistant:

static void process_expression(CompilerState *compiler_state, AstNode *node)
{
	switch (node->type) {
	case EXPR_FUNCTION:
		process_statement_list(compiler_state, node->function_expr.function_statement_list);
		break;
	case EXPR_SUFFIXED:
		process_expression(compiler_state, node->suffixed_expr.primary_expr);
		if (node->suffixed_expr.suffix_list) {
			process_expression_list(compiler_state, node->suffixed_expr.suffix_list);
		} else {
			// We can simplify and get rid of the suffixed expr
			// TODO free primary_expr
			memcpy(node, node->suffixed_expr.primary_expr, sizeof(AstNode));
		}
		break;
	case EXPR_FUNCTION_CALL:
		process_expression_list(compiler_state, node->function_call_expr.arg_list);
		break;
	case EXPR_SYMBOL:
		break;
	case EXPR_BINARY:
		if (node->binary_expr.binary_op == BINOPR_CONCAT) {
			flatten_concat_expression(compiler_state, node);
			goto L_string_concat;
		}
		process_expression(compiler_state, node->binary_expr.expr_left);
		process_expression(compiler_state, node->binary_expr.expr_right);
		if (node->binary_expr.expr_left->type == EXPR_LITERAL &&
		    node->binary_expr.expr_right->type == EXPR_LITERAL && 
			node->binary_expr.binary_op >= BINOPR_ADD &&
			node->binary_expr.binary_op <= BINOPR_SHR) {
			LiteralExpression result = { { RAVI_TANY } };
			if (luaO_rawarith(compiler_state, node->binary_expr.binary_op,
					  &node->binary_expr.expr_left->literal_expr,
					  &node->binary_expr.expr_right->literal_expr, &result)) {
				node->type = EXPR_LITERAL;
				node->literal_expr.type.type_code = result.type.type_code;
				if (node->literal_expr.type.type_code == RAVI_TNUMFLT)
					node->literal_expr.u.r = result.u.r;
				else {
					assert(node->literal_expr.type.type_code == RAVI_TNUMINT);
					node->literal_expr.u.i = result.u.i;
				}
				// TODO free expr_left and expr_right
			}
		}
		break;
	case EXPR_CONCAT:
	L_string_concat:
		process_expression_list(compiler_state, node->string_concatenation_expr.expr_list);
		break;
	case EXPR_UNARY:
		process_expression(compiler_state, node->unary_expr.expr);
		if (node->unary_expr.expr->type == EXPR_LITERAL && 
			(node->unary_expr.unary_op == UNOPR_BNOT || node->unary_expr.unary_op == UNOPR_MINUS)) {
			LiteralExpression result = { { RAVI_TANY } };
			if (luaO_rawarith(compiler_state, node->unary_expr.unary_op, &node->unary_expr.expr->literal_expr,
					  &node->unary_expr.expr->literal_expr, &result)) {
				node->type = EXPR_LITERAL;
				node->literal_expr.type.type_code = result.type.type_code;
				if (node->literal_expr.type.type_code == RAVI_TNUMFLT)
					node->literal_expr.u.r = result.u.r;
				else {
					assert(node->literal_expr.type.type_code == RAVI_TNUMINT);
					node->literal_expr.u.i = result.u.i;
				}
				// TODO free unary_expr.expr
			}
		}
		break;
	case EXPR_LITERAL:
		break;
	case EXPR_FIELD_SELECTOR:
		process_expression(compiler_state, node->index_expr.expr);
		break;
	case EXPR_Y_INDEX:
		process_expression(compiler_state, node->index_expr.expr);
		break;
	case EXPR_TABLE_ELEMENT_ASSIGN:
		if (node->table_elem_assign_expr.key_expr) {
			process_expression(compiler_state, node->table_elem_assign_expr.key_expr);
		}
		process_expression(compiler_state, node->table_elem_assign_expr.value_expr);
		break;
	case EXPR_TABLE_LITERAL:
		process_expression_list(compiler_state, node->table_expr.expr_list);
		break;
	case EXPR_BUILTIN:
		break;
	default:
		assert(0);
		break;
	}
}